

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O0

void UnitTest::CheckArrayEqual<int[3],int[3]>
               (TestResults *results,int (*expected) [3],int (*actual) [3],int count,
               TestDetails *details)

{
  ostream *poVar1;
  char *failure;
  int local_1e4;
  int local_1e0;
  int actualIndex;
  int expectedIndex;
  undefined1 local_1d0 [8];
  MemoryOutStream stream;
  int i;
  bool equal;
  TestDetails *details_local;
  int count_local;
  int (*actual_local) [3];
  int (*expected_local) [3];
  TestResults *results_local;
  
  stream._407_1_ = 1;
  for (stream._400_4_ = 0; (int)stream._400_4_ < count; stream._400_4_ = stream._400_4_ + 1) {
    stream._407_1_ =
         (stream._407_1_ & (*expected)[(int)stream._400_4_] == (*actual)[(int)stream._400_4_]) != 0;
  }
  if (stream._407_1_ == '\0') {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1d0);
    std::operator<<((ostream *)local_1d0,"Expected [ ");
    for (local_1e0 = 0; local_1e0 < count; local_1e0 = local_1e0 + 1) {
      poVar1 = (ostream *)std::ostream::operator<<(local_1d0,(*expected)[local_1e0]);
      std::operator<<(poVar1," ");
    }
    std::operator<<((ostream *)local_1d0,"] but was [ ");
    for (local_1e4 = 0; local_1e4 < count; local_1e4 = local_1e4 + 1) {
      poVar1 = (ostream *)std::ostream::operator<<(local_1d0,(*actual)[local_1e4]);
      std::operator<<(poVar1," ");
    }
    std::operator<<((ostream *)local_1d0,"]");
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1d0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1d0);
  }
  return;
}

Assistant:

void CheckArrayEqual(TestResults& results, Expected const& expected, Actual const& actual,
                int const count, TestDetails const& details)
{
    bool equal = true;
    for (int i = 0; i < count; ++i)
        equal &= (expected[i] == actual[i]);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

		stream << "Expected [ ";

		for (int expectedIndex = 0; expectedIndex < count; ++expectedIndex)
            stream << expected[expectedIndex] << " ";

		stream << "] but was [ ";

		for (int actualIndex = 0; actualIndex < count; ++actualIndex)
            stream << actual[actualIndex] << " ";

		stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}